

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O2

void __thiscall chrono::ChLinkPulley::ArchiveIN(ChLinkPulley *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_f0;
  ChNameValue<chrono::ChFrame<double>_> local_d8;
  ChNameValue<double> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkPulley>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_30._value = &this->tau;
  local_30._name = "tau";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->phase;
  local_48._name = "phase";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->checkphase;
  local_60._name = "checkphase";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->a1;
  local_78._name = "a1";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->a2;
  local_90._name = "a2";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->r1;
  local_a8._name = "r1";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->r2;
  local_c0._name = "r2";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  local_d8._value = &this->local_shaft1;
  local_d8._name = "local_shaft1";
  local_d8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_d8);
  local_f0._value = &this->local_shaft2;
  local_f0._name = "local_shaft2";
  local_f0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f0);
  return;
}

Assistant:

void ChLinkPulley::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkPulley>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(tau);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(checkphase);
    marchive >> CHNVP(a1);
    marchive >> CHNVP(a2);
    marchive >> CHNVP(r1);
    marchive >> CHNVP(r2);
    marchive >> CHNVP(local_shaft1);
    marchive >> CHNVP(local_shaft2);
}